

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

void __thiscall r_comp::Decompiler::write_indent(Decompiler *this,uint16_t i)

{
  char local_15;
  ushort local_14;
  uint16_t local_12;
  uint16_t j;
  Decompiler *pDStack_10;
  uint16_t i_local;
  Decompiler *this_local;
  
  local_12 = i;
  pDStack_10 = this;
  OutStream::operator<<(this->out_stream,(char (*) [2])0x1ca3d6);
  this->indents = local_12;
  for (local_14 = 0; local_14 < this->indents; local_14 = local_14 + 1) {
    local_15 = ' ';
    OutStream::operator<<(this->out_stream,&local_15);
  }
  return;
}

Assistant:

void Decompiler::write_indent(uint16_t i)
{
    *out_stream << "\n";
    indents = i;

    for (uint16_t j = 0; j < indents; j++) {
        *out_stream << ' ';
    }
}